

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

void chunk_undo(spng_ctx *ctx)

{
  spng_unknown_chunk *psVar1;
  ulong uVar2;
  uint uVar3;
  
  psVar1 = ctx->chunk_list;
  uVar3 = ctx->n_chunks - 1;
  (*(ctx->alloc).free_fn)(psVar1[uVar3].data);
  if (((ctx != (spng_ctx *)0x0) && (uVar2 = psVar1[uVar3].length, uVar2 != 0)) &&
     (uVar2 <= ctx->chunk_cache_usage)) {
    ctx->chunk_cache_usage = ctx->chunk_cache_usage - uVar2;
  }
  if ((ctx != (spng_ctx *)0x0) && (0x1f < ctx->chunk_cache_usage)) {
    ctx->chunk_cache_usage = ctx->chunk_cache_usage - 0x20;
  }
  psVar1[uVar3].data = (void *)0x0;
  ctx->n_chunks = ctx->n_chunks - 1;
  return;
}

Assistant:

static void chunk_undo(spng_ctx *ctx)
{
    struct spng_unknown_chunk *chunk = &ctx->chunk_list[ctx->n_chunks - 1];

    spng__free(ctx, chunk->data);

    decrease_cache_usage(ctx, chunk->length);
    decrease_cache_usage(ctx, sizeof(struct spng_unknown_chunk));

    chunk->data = NULL;

    ctx->n_chunks--;
}